

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::tracker_list::replace
          (tracker_list *this,
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *aes)

{
  byte bVar1;
  announce_entry *paVar2;
  bool bVar3;
  ulong uVar4;
  type *this_00;
  type_conflict4 *ptVar5;
  pointer ppVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  __enable_if_t<is_constructible<value_type,_pair<basic_string_view<char>,_announce_entry_*>_&&>::value,_pair<iterator,_bool>_>
  _Var8;
  type *added;
  type *iter;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>
  local_68;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_false,_true>,_bool>
  local_50;
  element_type *local_40;
  announce_entry *new_ae;
  announce_entry *ae;
  const_iterator __end2;
  const_iterator __begin2;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  *__range2;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  *aes_local;
  tracker_list *this_local;
  
  boost::intrusive::
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
  ::clear(&(this->m_trackers).super_type);
  ::std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>_>_>
  ::clear(&this->m_url_index);
  boost::object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>::
  ~object_pool(&this->m_storage);
  boost::object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>::
  object_pool(&this->m_storage,0x20,0);
  __end2 = ::std::
           vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ::begin(aes);
  ae = (announce_entry *)
       ::std::
       vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>::
       end(aes);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
                                *)&ae);
    if (!bVar3) break;
    new_ae = (announce_entry *)
             __gnu_cxx::
             __normal_iterator<const_libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
             ::operator*(&__end2);
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_40 = boost::
                 object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>
                 ::construct<libtorrent::v1_2::announce_entry>
                           (&this->m_storage,(announce_entry *)new_ae);
      bVar7 = (basic_string_view<char,_std::char_traits<char>_>)
              ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_40->url);
      local_78 = bVar7;
      ::std::
      make_pair<std::basic_string_view<char,std::char_traits<char>>,libtorrent::aux::announce_entry*&>
                (&local_68,&local_78,&local_40);
      _Var8 = ::std::
              unordered_map<std::basic_string_view<char,std::char_traits<char>>,libtorrent::aux::announce_entry*,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>>>
              ::
              insert<std::pair<std::basic_string_view<char,std::char_traits<char>>,libtorrent::aux::announce_entry*>>
                        ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,libtorrent::aux::announce_entry*,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>>>
                          *)&this->m_url_index,&local_68);
      local_50.first =
           _Var8.first.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_true>
           ._M_cur;
      local_50.second = _Var8.second;
      this_00 = ::std::
                get<0ul,std::__detail::_Node_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>,false,true>,bool>
                          (&local_50);
      ptVar5 = ::std::
               get<1ul,std::__detail::_Node_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>,false,true>,bool>
                         (&local_50);
      if ((*ptVar5 & 1U) == 0) {
        boost::
        object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>::
        destroy(&this->m_storage,local_40);
        bVar1 = *(byte *)((long)&(new_ae->endpoints).
                                 super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 2);
        ppVar6 = ::std::__detail::
                 _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_false,_true>
                 ::operator->(this_00);
        paVar2 = ppVar6->second;
        paVar2->field_0x6e = paVar2->field_0x6e & 0xf0 | paVar2->field_0x6e & 0xf | bVar1 & 0xf;
      }
      else {
        boost::intrusive::
        list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
        ::push_back(&(this->m_trackers).super_type,local_40);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
    ::operator++(&__end2);
  }
  boost::intrusive::
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
  ::
  sort<libtorrent::aux::tracker_list::replace(std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>const&)::__0>
            ((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
              *)&this->m_trackers);
  this->m_last_working_tracker = (announce_entry *)0x0;
  return;
}

Assistant:

void tracker_list::replace(std::vector<lt::announce_entry> const& aes)
{
	INVARIANT_CHECK;

	m_trackers.clear();
	m_url_index.clear();

	m_storage.~object_pool<aux::announce_entry>();
	new (&m_storage) boost::object_pool<aux::announce_entry>();

	for (auto const& ae : aes)
	{
		if (ae.url.empty()) continue;
		aux::announce_entry* new_ae = m_storage.construct(ae);
		auto const [iter, added] = m_url_index.insert(std::make_pair(string_view(new_ae->url), new_ae));
		if (!added)
		{
			// if we already have an entry with this URL, skip it
			// but merge the source bits
			m_storage.destroy(new_ae);
			iter->second->source |= ae.source;
			continue;
		}
		m_trackers.push_back(*new_ae);
	}

	// make sure the trackers are correctly ordered by tier
	m_trackers.sort([](aux::announce_entry const& lhs, aux::announce_entry const& rhs)
	{ return lhs.tier < rhs.tier; });

	m_last_working_tracker = nullptr;
}